

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptRegExp::SetPropertyBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          BOOL *result)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ScriptConfiguration *this_00;
  ScriptConfiguration *scriptConfig;
  BOOL *result_local;
  PropertyOperationFlags flags_local;
  Var value_local;
  PropertyId propertyId_local;
  JavascriptRegExp *this_local;
  
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_00 = ScriptContext::GetConfig(pSVar2);
  if ((propertyId != 0x153) && (propertyId != 0x1a0)) {
    if (propertyId == 0x1a2) {
      Memory::WriteBarrierPtr<void>::operator=(&this->lastIndexVar,value);
      this->lastIndexOrFlag = 0xfffffffe;
      *result = 1;
      return true;
    }
    if (propertyId != 0x1a3) {
      if (propertyId == 0x1a4) {
        bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_00);
        if ((bVar1) &&
           (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), !bVar1)) {
          pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
          JavascriptError::ThrowCantAssignIfStrictMode(flags,pSVar2);
          *result = 0;
          return true;
        }
        return false;
      }
      if (propertyId != 0x1a5) {
        if (propertyId == 0x1a6) {
          bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
          if ((bVar1) &&
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), !bVar1)) {
            pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
            JavascriptError::ThrowCantAssignIfStrictMode(flags,pSVar2);
            *result = 0;
            return true;
          }
          return false;
        }
        if (propertyId == 0x1a7) {
          bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(this_00);
          if ((bVar1) &&
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00), !bVar1)) {
            pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
            JavascriptError::ThrowCantAssignIfStrictMode(flags,pSVar2);
            *result = 0;
            return true;
          }
          return false;
        }
        if (propertyId != 0x1e0) {
          return false;
        }
      }
    }
  }
  bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
  if (!bVar1) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowCantAssignIfStrictMode(flags,pSVar2);
    *result = 0;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool JavascriptRegExp::SetPropertyBuiltIns(PropertyId propertyId, Var value, PropertyOperationFlags flags, BOOL* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define SET_PROPERTY(ownProperty) \
        if (ownProperty) \
        { \
            JavascriptError::ThrowCantAssignIfStrictMode(flags, this->GetScriptContext()); \
            *result = false; \
            return true; \
        } \
        return false;

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            this->lastIndexVar = value;
            lastIndexOrFlag = NotCachedValue;
            *result = true;
            return true;
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            SET_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            SET_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            SET_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            SET_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return false;
        }

#undef SET_PROPERTY
    }